

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

Polynomial<double> *
rtb::Filter::multiply<double>
          (Polynomial<double> *__return_storage_ptr__,Polynomial<double> *p1,Polynomial<double> *p2)

{
  allocator<std::complex<double>_> *paVar1;
  size_t sVar2;
  size_t sVar3;
  const_reference pvVar4;
  const_reference __y;
  reference pvVar5;
  size_type sVar6;
  reference __y_00;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  allocator<std::complex<double>_> local_141;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_140;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_138;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_130;
  undefined1 local_118 [8];
  Polynomial<double> polyResult;
  undefined1 local_e8 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  local_d8;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  it;
  uint local_bc;
  uint local_b8;
  uint i_2;
  uint k;
  uint i_1;
  uint i;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> temp2;
  undefined1 local_88 [8];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> temp1;
  undefined1 local_68 [8];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> resultCoefficients;
  size_t resultOrder;
  Polynomial<double> *p2_local;
  Polynomial<double> *p1_local;
  Polynomial<double> *result;
  
  sVar2 = Polynomial<double>::getOrder(p1);
  sVar3 = Polynomial<double>::getOrder(p2);
  sVar2 = sVar2 + sVar3;
  Polynomial<double>::Polynomial(__return_storage_ptr__,sVar2);
  if (sVar2 == 0) {
    pvVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                       (&p1->coefficients_,0);
    __y = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                    (&p2->coefficients_,0);
    std::operator*(pvVar4,__y);
    pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                       (&__return_storage_ptr__->coefficients_,0);
    *(undefined8 *)pvVar5->_M_value = extraout_XMM0_Qa;
    *(undefined8 *)(pvVar5->_M_value + 8) = in_XMM1_Qa;
  }
  else {
    paVar1 = (allocator<std::complex<double>_> *)
             ((long)&temp1.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<std::complex<double>_>::allocator(paVar1);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_68,
               sVar2 * 2 + 1,paVar1);
    std::allocator<std::complex<double>_>::~allocator
              ((allocator<std::complex<double>_> *)
               ((long)&temp1.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    paVar1 = (allocator<std::complex<double>_> *)
             ((long)&temp2.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<std::complex<double>_>::allocator(paVar1);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_88,
               sVar2 * 2 + 1,paVar1);
    std::allocator<std::complex<double>_>::~allocator
              ((allocator<std::complex<double>_> *)
               ((long)&temp2.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<std::complex<double>_>::allocator
              ((allocator<std::complex<double>_> *)((long)&i_1 + 3));
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&i,
               sVar2 * 2 + 1,(allocator<std::complex<double>_> *)((long)&i_1 + 3));
    std::allocator<std::complex<double>_>::~allocator
              ((allocator<std::complex<double>_> *)((long)&i_1 + 3));
    for (k = 0; sVar3 = Polynomial<double>::getSize(p1), k < sVar3; k = k + 1) {
      pvVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                         (&p1->coefficients_,(ulong)k);
      pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          local_88,(ulong)k);
      *(undefined8 *)pvVar5->_M_value = *(undefined8 *)pvVar4->_M_value;
      *(undefined8 *)(pvVar5->_M_value + 8) = *(undefined8 *)(pvVar4->_M_value + 8);
    }
    for (i_2 = 0; sVar3 = Polynomial<double>::getSize(p2), i_2 < sVar3; i_2 = i_2 + 1) {
      pvVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                         (&p2->coefficients_,(ulong)i_2);
      pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&i
                          ,(ulong)i_2);
      *(undefined8 *)pvVar5->_M_value = *(undefined8 *)pvVar4->_M_value;
      *(undefined8 *)(pvVar5->_M_value + 8) = *(undefined8 *)(pvVar4->_M_value + 8);
    }
    for (local_b8 = 0;
        sVar6 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                          ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                           local_68), (ulong)local_b8 < sVar6 - 1; local_b8 = local_b8 + 1) {
      for (local_bc = 0; local_bc <= local_b8; local_bc = local_bc + 1) {
        pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                           ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                            local_88,(ulong)local_bc);
        __y_00 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                           ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                            &i,(ulong)(local_b8 - local_bc));
        std::operator*(pvVar5,__y_00);
        pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                           ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                            local_68,(ulong)local_b8);
        std::complex<double>::operator+=(pvVar5,(complex<double> *)&it);
      }
    }
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::rbegin
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               (local_e8 + 8));
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::rend
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
    std::
    find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>,rtb::Filter::multiply<double>(rtb::Filter::Polynomial<double>const&,rtb::Filter::Polynomial<double>const&)::_lambda(std::complex<double>)_1_>
              (&local_d8,
               (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               (local_e8 + 8),
               (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e8);
    local_138._M_current =
         (complex<double> *)
         std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                   ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_68
                   );
    local_140._M_current =
         (complex<double> *)
         std::
         reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
         ::base(&local_d8);
    std::allocator<std::complex<double>_>::allocator(&local_141);
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    vector<__gnu_cxx::__normal_iterator<std::complex<double>*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,void>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_130,
               local_138,local_140,&local_141);
    Polynomial<double>::Polynomial((Polynomial<double> *)local_118,&local_130);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector(&local_130);
    std::allocator<std::complex<double>_>::~allocator(&local_141);
    Polynomial<double>::operator=(__return_storage_ptr__,(Polynomial<double> *)local_118);
    Polynomial<double>::~Polynomial((Polynomial<double> *)local_118);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&i);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_88);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Polynomial<T> multiply(const Polynomial<T>& p1, const Polynomial<T>& p2) {

            typedef typename Polynomial<T>::Complex Complex;

            size_t resultOrder(p1.getOrder() + p2.getOrder());
            Polynomial<T> result(resultOrder);
            if (resultOrder == 0) {
                result.coefficients_.at(0) = p1.coefficients_.at(0)*p2.coefficients_.at(0);
            }
            else {
                std::vector<Complex> resultCoefficients(2 * resultOrder + 1);
                std::vector<Complex> temp1(2 * resultOrder + 1), temp2(2 * resultOrder + 1);
                for (unsigned i{ 0 }; i < p1.getSize(); ++i)
                    temp1.at(i) = p1.coefficients_.at(i);

                for (unsigned i{ 0 }; i < p2.getSize(); ++i)
                    temp2.at(i) = p2.coefficients_.at(i);

                for (unsigned k{ 0 }; k < resultCoefficients.size() - 1; ++k)
                    for (unsigned i{ 0 }; i <= k; ++i)
                        resultCoefficients.at(k) += temp1.at(i)*temp2.at(k - i);

                auto it = std::find_if(resultCoefficients.rbegin(), resultCoefficients.rend(), [](Complex v){ return std::abs(v) != 0;      });

                Polynomial<T> polyResult(std::vector<Complex>(resultCoefficients.begin(), it.base()));
                result = polyResult;
            }
            return result;
        }